

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O3

void vkt::ssbo::anon_unknown_15::generateImmMatrixSrc
               (ostream *src,DataType basicType,int matrixStride,bool isRowMajor,void *valuePtr)

{
  int iVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  int precision;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int local_70;
  int local_68;
  string local_58;
  void *local_38;
  
  local_38 = valuePtr;
  iVar1 = glu::getDataTypeMatrixNumRows(basicType);
  iVar2 = glu::getDataTypeMatrixNumColumns(basicType);
  __s = glu::getDataTypeName(basicType);
  if (__s == (char *)0x0) {
    std::ios::clear((int)src + (int)*(undefined8 *)(*(long *)src + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(src,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(src,"(",1);
  if (0 < iVar2) {
    local_68 = 0;
    local_70 = 0;
    iVar7 = 0;
    uVar4 = extraout_RDX;
    do {
      if (0 < iVar1) {
        iVar8 = 0;
        iVar5 = local_68;
        iVar6 = local_70;
        do {
          precision = (int)uVar4;
          iVar9 = iVar6;
          if (isRowMajor) {
            iVar9 = iVar5;
          }
          if (iVar7 != 0 || iVar8 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(src,", ",2);
            precision = extraout_EDX;
          }
          de::floatToString_abi_cxx11_
                    (&local_58,(de *)&DAT_00000001,*(float *)((long)local_38 + (long)iVar9),
                     precision);
          std::__ostream_insert<char,std::char_traits<char>>
                    (src,local_58._M_dataplus._M_p,local_58._M_string_length);
          uVar4 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            uVar4 = extraout_RDX_01;
          }
          iVar8 = iVar8 + 1;
          iVar6 = iVar6 + 4;
          iVar5 = iVar5 + matrixStride;
        } while (iVar1 != iVar8);
      }
      iVar7 = iVar7 + 1;
      local_70 = local_70 + matrixStride;
      local_68 = local_68 + 4;
    } while (iVar7 != iVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(src,")",1);
  return;
}

Assistant:

void generateImmMatrixSrc (std::ostream& src, glu::DataType basicType, int matrixStride, bool isRowMajor, const void* valuePtr)
{
	DE_ASSERT(glu::isDataTypeMatrix(basicType));

	const int		compSize		= sizeof(deUint32);
	const int		numRows			= glu::getDataTypeMatrixNumRows(basicType);
	const int		numCols			= glu::getDataTypeMatrixNumColumns(basicType);

	src << glu::getDataTypeName(basicType) << "(";

	// Constructed in column-wise order.
	for (int colNdx = 0; colNdx < numCols; colNdx++)
	{
		for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
		{
			const deUint8*	compPtr	= (const deUint8*)valuePtr + (isRowMajor ? rowNdx*matrixStride + colNdx*compSize
																				: colNdx*matrixStride + rowNdx*compSize);

			if (colNdx > 0 || rowNdx > 0)
				src << ", ";

			src << de::floatToString(*((const float*)compPtr), 1);
		}
	}

	src << ")";
}